

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

void __thiscall
slang::ast::PackedArrayType::PackedArrayType
          (PackedArrayType *this,Type *elementType,ConstantRange range,bitwidth_t fullWidth)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Type::isSigned(elementType);
  bVar2 = Type::isFourState(elementType);
  (this->super_IntegralType).super_Type.super_Symbol.kind = PackedArrayType;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_len = 0;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_str = "";
  (this->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->super_IntegralType).super_Type.canonical = (Type *)this;
  (this->super_IntegralType).bitWidth = fullWidth;
  (this->super_IntegralType).isSigned = bVar1;
  (this->super_IntegralType).isFourState = bVar2;
  this->elementType = elementType;
  this->range = range;
  return;
}

Assistant:

PackedArrayType::PackedArrayType(const Type& elementType, ConstantRange range,
                                 bitwidth_t fullWidth) :
    IntegralType(SymbolKind::PackedArrayType, "", SourceLocation(), fullWidth,
                 elementType.isSigned(), elementType.isFourState()),
    elementType(elementType), range(range) {
}